

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

With * sqlite3WithAdd(Parse *pParse,With *pWith,Cte *pCte)

{
  sqlite3 *psVar1;
  int iVar2;
  long *in_RDX;
  With *in_RSI;
  Parse *in_RDI;
  sqlite3_int64 nByte;
  int i;
  char *zName;
  With *pNew;
  sqlite3 *db;
  Cte *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  sqlite3 *db_00;
  With *local_30;
  With *local_8;
  
  psVar1 = in_RDI->db;
  local_8 = in_RSI;
  if (in_RDX != (long *)0x0) {
    db_00 = (sqlite3 *)*in_RDX;
    if ((db_00 != (sqlite3 *)0x0) && (in_RSI != (With *)0x0)) {
      for (in_stack_ffffffffffffffc4 = 0; in_stack_ffffffffffffffc4 < in_RSI->nCte;
          in_stack_ffffffffffffffc4 = in_stack_ffffffffffffffc4 + 1) {
        iVar2 = sqlite3StrICmp((char *)db_00,in_RSI->a[in_stack_ffffffffffffffc4].zName);
        if (iVar2 == 0) {
          sqlite3ErrorMsg(in_RDI,"duplicate WITH table name: %s",db_00);
        }
      }
    }
    if (in_RSI == (With *)0x0) {
      local_30 = (With *)sqlite3DbMallocZero((sqlite3 *)
                                             CONCAT44(in_stack_ffffffffffffffc4,
                                                      in_stack_ffffffffffffffc0),
                                             (u64)in_stack_ffffffffffffffb8);
    }
    else {
      in_stack_ffffffffffffffb8 = (Cte *)((long)in_RSI->nCte * 0x30 + 0x40);
      local_30 = (With *)sqlite3DbRealloc(db_00,(void *)CONCAT44(in_stack_ffffffffffffffc4,
                                                                 in_stack_ffffffffffffffc0),
                                          (u64)in_stack_ffffffffffffffb8);
    }
    if (psVar1->mallocFailed == '\0') {
      iVar2 = local_30->nCte;
      local_30->nCte = iVar2 + 1;
      memcpy(local_30->a + iVar2,in_RDX,0x30);
      sqlite3DbFree((sqlite3 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                    in_stack_ffffffffffffffb8);
    }
    else {
      sqlite3CteDelete((sqlite3 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffb8);
      local_30 = in_RSI;
    }
    local_8 = local_30;
  }
  return local_8;
}

Assistant:

SQLITE_PRIVATE With *sqlite3WithAdd(
  Parse *pParse,          /* Parsing context */
  With *pWith,            /* Existing WITH clause, or NULL */
  Cte *pCte               /* CTE to add to the WITH clause */
){
  sqlite3 *db = pParse->db;
  With *pNew;
  char *zName;

  if( pCte==0 ){
    return pWith;
  }

  /* Check that the CTE name is unique within this WITH clause. If
  ** not, store an error in the Parse structure. */
  zName = pCte->zName;
  if( zName && pWith ){
    int i;
    for(i=0; i<pWith->nCte; i++){
      if( sqlite3StrICmp(zName, pWith->a[i].zName)==0 ){
        sqlite3ErrorMsg(pParse, "duplicate WITH table name: %s", zName);
      }
    }
  }

  if( pWith ){
    sqlite3_int64 nByte = sizeof(*pWith) + (sizeof(pWith->a[1]) * pWith->nCte);
    pNew = sqlite3DbRealloc(db, pWith, nByte);
  }else{
    pNew = sqlite3DbMallocZero(db, sizeof(*pWith));
  }
  assert( (pNew!=0 && zName!=0) || db->mallocFailed );

  if( db->mallocFailed ){
    sqlite3CteDelete(db, pCte);
    pNew = pWith;
  }else{
    pNew->a[pNew->nCte++] = *pCte;
    sqlite3DbFree(db, pCte);
  }

  return pNew;
}